

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

bool LTOnlineChannel::IsRevocationError(string *err)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  string s;
  allocator<char> local_51;
  long *local_50 [2];
  long local_40 [2];
  
  bVar3 = true;
  lVar2 = 0;
  while( true ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,*(char **)((long)&PTR_anon_var_dwarf_1e8371_002deb98 + lVar2),
               &local_51);
    lVar1 = std::__cxx11::string::find((char *)err,(ulong)local_50[0],0);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (lVar1 != -1) break;
    lVar2 = lVar2 + 8;
    bVar3 = lVar2 != 0x18;
    if (!bVar3) {
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool LTOnlineChannel::IsRevocationError (const std::string& err)
{
    // we can check for the word "revocation", but in localized versions of
    // Windows this is translated! We have, so far, seen two different error codes.
    // So what we do is to look for all three things:
    for (const std::string s: ERR_CURL_REVOKE_MSG)
        if (err.find(s) != std::string::npos)
            return true;
    return false;
}